

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld_sampler.cpp
# Opt level: O0

__m256 * __thiscall LDSampler::sample(LDSampler *this,mt19937 *rng,Vec2f_8 *samples)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [32];
  bool bVar5;
  result_type x_00;
  result_type y_00;
  undefined7 extraout_var;
  LDSampler *pLVar6;
  undefined1 (*in_RDX) [32];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RSI;
  LDSampler *in_RDI;
  __m256 active;
  int n;
  float y [8];
  float x [8];
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  Vec2f_8 *in_stack_fffffffffffffde8;
  Vec2f_8 *this_00;
  int local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 (*local_118) [32];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_110;
  undefined4 local_d8;
  float *local_d0;
  float *local_c8;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_118 = in_RDX;
  local_110 = in_RSI;
  bVar5 = has_samples(in_RDI);
  if (bVar5) {
    local_140 = 0xbf800000bf800000;
    uStack_138 = 0xbf800000bf800000;
    uStack_130 = 0xbf800000bf800000;
    uStack_128 = 0xbf800000bf800000;
    local_160 = 0xbf800000bf800000;
    uStack_158 = 0xbf800000bf800000;
    uStack_150 = 0xbf800000bf800000;
    uStack_148 = 0xbf800000bf800000;
    local_164 = in_RDI->spp - in_RDI->samples_taken;
    if (8 < local_164) {
      local_164 = 8;
    }
    this_00 = (Vec2f_8 *)&in_RDI->distrib;
    x_00 = std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)this_00,local_110);
    y_00 = std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)this_00,local_110);
    sample2d(local_164,x_00,y_00,(float *)&local_140,(float *)&local_160,in_RDI->samples_taken);
    std::
    shuffle<float*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((float *)&local_140,(float *)((long)&local_140 + (long)local_164 * 4),local_110);
    std::
    shuffle<float*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
              ((float *)&local_160,(float *)((long)&local_160 + (long)local_164 * 4),local_110);
    *(undefined8 *)*local_118 = local_140;
    *(undefined8 *)(*local_118 + 8) = uStack_138;
    *(undefined8 *)(*local_118 + 0x10) = uStack_130;
    *(undefined8 *)(*local_118 + 0x18) = uStack_128;
    *(undefined8 *)local_118[1] = local_160;
    *(undefined8 *)(local_118[1] + 8) = uStack_158;
    *(undefined8 *)(local_118[1] + 0x10) = uStack_150;
    *(undefined8 *)(local_118[1] + 0x18) = uStack_148;
    local_d8 = 0xbf000000;
    local_34 = 0xbf000000;
    local_38 = 0xbf000000;
    local_3c = 0xbf000000;
    local_40 = 0xbf000000;
    local_44 = 0xbf000000;
    local_48 = 0xbf000000;
    local_4c = 0xbf000000;
    local_50 = 0xbf000000;
    auVar2 = vinsertps_avx(ZEXT416(0xbf000000),ZEXT416(0xbf000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf000000),0x20);
    local_80 = vinsertps_avx(auVar2,ZEXT416(0xbf000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbf000000),ZEXT416(0xbf000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf000000),0x20);
    auStack_70 = vinsertps_avx(auVar2,ZEXT416(0xbf000000),0x30);
    auVar4._16_16_ = auStack_70;
    auVar4._0_16_ = local_80;
    uVar3 = vcmpps_avx512vl(auVar4,*local_118,1);
    auVar4 = vpmovm2d_avx512vl(uVar3);
    vcvtusi2ss_avx512f(auVar4._0_16_,(in_RDI->current).first);
    vcvtusi2ss_avx512f(SUB3216(*local_118,0),(in_RDI->current).second);
    local_d0 = (float *)&local_160;
    local_c8 = (float *)&local_140;
    Vec2f_8::Vec2f_8(in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,in_stack_fffffffffffffde0);
    Vec2f_8::operator+=(this_00,in_stack_fffffffffffffde8);
    in_RDI->samples_taken = local_164 + in_RDI->samples_taken;
    pLVar6 = (LDSampler *)(ulong)in_RDI->samples_taken;
    if (in_RDI->spp <= in_RDI->samples_taken) {
      in_RDI->samples_taken = 0;
      (in_RDI->current).first = (in_RDI->current).first + 1;
      uVar1 = (in_RDI->current).first;
      pLVar6 = (LDSampler *)(ulong)uVar1;
      if (uVar1 == (in_RDI->start).first + in_RDI->block_dim) {
        (in_RDI->current).first = (in_RDI->start).first;
        (in_RDI->current).second = (in_RDI->current).second + 1;
        pLVar6 = in_RDI;
      }
    }
  }
  else {
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    vinsertps_avx(auVar2,ZEXT416(0),0x30);
    pLVar6 = (LDSampler *)CONCAT71(extraout_var,bVar5);
  }
  return (__m256 *)pLVar6;
}

Assistant:

__m256 LDSampler::sample(std::mt19937 &rng, Vec2f_8 &samples){
	if (!has_samples()){
		return _mm256_set1_ps(0.f);
	}
	CACHE_ALIGN float x[8] = {-1, -1, -1, -1, -1, -1, -1, -1};
	CACHE_ALIGN float y[8] = {-1, -1, -1, -1, -1, -1, -1, -1};

	// Take at most 8 samples per sampling pass since that's how many we can
	// fit into a packet
	int n = spp - samples_taken;
	if (n > 8){
		n = 8;
	}
	sample2d(n, distrib(rng), distrib(rng), x, y, samples_taken);
	std::shuffle(x, x + n, rng);
	std::shuffle(y, y + n, rng);
	samples.x = _mm256_load_ps(x);
	samples.y = _mm256_load_ps(y);
	// We use -1 to signal that there is no sample to be taken for the lane, so
	// compute mask of those samples which shouldn't be used
	const auto active = _mm256_cmp_ps(samples.x, _mm256_set1_ps(-0.5f), _CMP_GT_OQ);
	samples += Vec2f_8{static_cast<float>(current.first), static_cast<float>(current.second)};

	samples_taken += n;
	// We're done sampling this pixel, move to the next one
	if (samples_taken >= spp){
		samples_taken = 0;
		++current.first;
		if (current.first == start.first + block_dim){
			current.first = start.first;
			++current.second;
		}
	}
	return active;
}